

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::TensorValue::TensorValue(TensorValue *this,TensorValue *from)

{
  TensorValue_RepeatedFloats *this_00;
  TensorValue_RepeatedLongInts *this_01;
  TensorValue_RepeatedBools *this_02;
  TensorValue_RepeatedStrings *this_03;
  TensorValue_RepeatedInts *this_04;
  TensorValue_RepeatedDoubles *this_05;
  TensorValue_RepeatedBytes *this_06;
  undefined1 *puVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TensorValue_003fa858;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->_oneof_case_[0] = 0;
  switch(from->_oneof_case_[0]) {
  case 1:
    this_00 = _internal_mutable_floats(this);
    if (from->_oneof_case_[0] == 1) {
      puVar1 = (undefined1 *)(from->value_).floats_;
    }
    else {
      puVar1 = _TensorValue_RepeatedFloats_default_instance_;
    }
    TensorValue_RepeatedFloats::MergeFrom(this_00,(TensorValue_RepeatedFloats *)puVar1);
    break;
  case 2:
    this_04 = _internal_mutable_ints(this);
    if (from->_oneof_case_[0] == 2) {
      puVar1 = (undefined1 *)(from->value_).ints_;
    }
    else {
      puVar1 = _TensorValue_RepeatedInts_default_instance_;
    }
    TensorValue_RepeatedInts::MergeFrom(this_04,(TensorValue_RepeatedInts *)puVar1);
    break;
  case 3:
    this_02 = _internal_mutable_bools(this);
    if (from->_oneof_case_[0] == 3) {
      puVar1 = (undefined1 *)(from->value_).bools_;
    }
    else {
      puVar1 = _TensorValue_RepeatedBools_default_instance_;
    }
    TensorValue_RepeatedBools::MergeFrom(this_02,(TensorValue_RepeatedBools *)puVar1);
    break;
  case 4:
    this_03 = _internal_mutable_strings(this);
    if (from->_oneof_case_[0] == 4) {
      puVar1 = (undefined1 *)(from->value_).strings_;
    }
    else {
      puVar1 = _TensorValue_RepeatedStrings_default_instance_;
    }
    TensorValue_RepeatedStrings::MergeFrom(this_03,(TensorValue_RepeatedStrings *)puVar1);
    break;
  case 5:
    this_01 = _internal_mutable_longints(this);
    if (from->_oneof_case_[0] == 5) {
      puVar1 = (undefined1 *)(from->value_).longints_;
    }
    else {
      puVar1 = _TensorValue_RepeatedLongInts_default_instance_;
    }
    TensorValue_RepeatedLongInts::MergeFrom(this_01,(TensorValue_RepeatedLongInts *)puVar1);
    break;
  case 6:
    this_05 = _internal_mutable_doubles(this);
    if (from->_oneof_case_[0] == 6) {
      puVar1 = (undefined1 *)(from->value_).doubles_;
    }
    else {
      puVar1 = _TensorValue_RepeatedDoubles_default_instance_;
    }
    TensorValue_RepeatedDoubles::MergeFrom(this_05,(TensorValue_RepeatedDoubles *)puVar1);
    break;
  case 7:
    this_06 = _internal_mutable_bytes(this);
    if (from->_oneof_case_[0] == 7) {
      puVar1 = (undefined1 *)(from->value_).bytes_;
    }
    else {
      puVar1 = _TensorValue_RepeatedBytes_default_instance_;
    }
    TensorValue_RepeatedBytes::MergeFrom(this_06,(TensorValue_RepeatedBytes *)puVar1);
  }
  return;
}

Assistant:

TensorValue::TensorValue(const TensorValue& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  clear_has_value();
  switch (from.value_case()) {
    case kFloats: {
      _internal_mutable_floats()->::CoreML::Specification::MILSpec::TensorValue_RepeatedFloats::MergeFrom(from._internal_floats());
      break;
    }
    case kInts: {
      _internal_mutable_ints()->::CoreML::Specification::MILSpec::TensorValue_RepeatedInts::MergeFrom(from._internal_ints());
      break;
    }
    case kBools: {
      _internal_mutable_bools()->::CoreML::Specification::MILSpec::TensorValue_RepeatedBools::MergeFrom(from._internal_bools());
      break;
    }
    case kStrings: {
      _internal_mutable_strings()->::CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::MergeFrom(from._internal_strings());
      break;
    }
    case kLongInts: {
      _internal_mutable_longints()->::CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts::MergeFrom(from._internal_longints());
      break;
    }
    case kDoubles: {
      _internal_mutable_doubles()->::CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles::MergeFrom(from._internal_doubles());
      break;
    }
    case kBytes: {
      _internal_mutable_bytes()->::CoreML::Specification::MILSpec::TensorValue_RepeatedBytes::MergeFrom(from._internal_bytes());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.TensorValue)
}